

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

int test_trie_char_add(void)

{
  int iVar1;
  void *__ptr;
  uint32_t node_id_inserted;
  trie_s *trie;
  int res;
  
  __ptr = (void *)yatrie_new(500,500,100);
  iVar1 = yatrie_char_add(0,0x5f,__ptr);
  if (iVar1 != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1bf,"node_id_inserted == 1");
  }
  trie._4_4_ = (uint)(iVar1 != 1);
  iVar1 = yatrie_char_add(0,0x5f,__ptr);
  if (iVar1 != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1c3,"node_id_inserted == 1");
    trie._4_4_ = trie._4_4_ + 1;
  }
  iVar1 = yatrie_char_add(1,2,__ptr);
  if (iVar1 != 2) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1c7,"node_id_inserted == 2");
    trie._4_4_ = trie._4_4_ + 1;
  }
  iVar1 = yatrie_char_add(2,0x32,__ptr);
  if (iVar1 != 3) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1cb,"node_id_inserted == 3");
    trie._4_4_ = trie._4_4_ + 1;
  }
  free(__ptr);
  return trie._4_4_;
}

Assistant:

static int test_trie_char_add() {
    int res = 0;
    //create trie
    trie_s *trie = yatrie_new(500, 500, 100);


    uint32_t node_id_inserted;

    //add char index 95 to the node_s 0, returns 1
    node_id_inserted = yatrie_char_add(0, 95, trie);
    U_ASSERT(res, node_id_inserted == 1);

    //add char index 95 to the node_s 0 again. Must return same node_id 1
    node_id_inserted = yatrie_char_add(0, 95, trie);
    U_ASSERT(res, node_id_inserted == 1);

    //add second char index 2 to the node_s 1, returns 2
    node_id_inserted = yatrie_char_add(1, 2, trie);
    U_ASSERT(res, node_id_inserted == 2);

    //add third char index 50 to the node_s 2, returns 3
    node_id_inserted = yatrie_char_add(2, 50, trie);
    U_ASSERT(res, node_id_inserted == 3);

    free(trie);
    return res;
}